

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser_exp4::UnitTest_parser_exp4(UnitTest_parser_exp4 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_002688d0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"parser_exp4");
  return;
}

Assistant:

TEST_CASE(parser_exp4)
{
    auto root = Parse("a = (-1 + 1) * 2 / 1 ^ 2 and 1 or 2");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];

    // or
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == luna::Token_Or);
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));

    // and
    bin_exp = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == luna::Token_And);
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));

    // (-1 + 1) * 2 / 1 ^ 2
    bin_exp = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(bin_exp->op_token_.token_ == '/');

    // *
    auto left = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '*');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // (-1 + 1)
    left = dynamic_cast<luna::BinaryExpression *>(left->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // -1
    auto unary = dynamic_cast<luna::UnaryExpression *>(left->left_.get());
    EXPECT_TRUE(unary);
    EXPECT_TRUE(unary->op_token_.token_ == '-');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(unary->exp_.get()));

    // 1 ^ 2
    auto right = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '^');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->right_.get()));
}